

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_join_ti_impl.h
# Opt level: O0

void __thiscall
join::
TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::upperbound(TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
             *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                   *trees_collection,
            vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
            vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result,
            double distance_threshold)

{
  bool bVar1;
  pointer ppVar2;
  reference pvVar3;
  pointer ppVar4;
  reference __p;
  reference this_00;
  double local_298;
  double ub_value;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_280;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_278;
  iterator it;
  TreeIndexLGM ti_2;
  TreeIndexLGM ti_1;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> lgm_algorithm;
  AlgsCostModel cm;
  double distance_threshold_local;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates_local;
  vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
  *trees_collection_local;
  TJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
  *this_local;
  
  cost_model::UnitCostModelLD<label::StringLabel>::UnitCostModelLD
            ((UnitCostModelLD<label::StringLabel> *)
             &lgm_algorithm.t2_label_il_._M_h._M_single_bucket,&this->ld_);
  ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
  TEDAlgorithm((LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *)
               &ti_1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                _M_single_bucket,
               (UnitCostModelLD<label::StringLabel> *)
               &lgm_algorithm.t2_label_il_._M_h._M_single_bucket);
  node::TreeIndexLGM::TreeIndexLGM
            ((TreeIndexLGM *)
             &ti_2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
              _M_single_bucket);
  node::TreeIndexLGM::TreeIndexLGM((TreeIndexLGM *)&it);
  local_278._M_current =
       (pair<int,_int> *)
       std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin(candidates);
  while( true ) {
    local_280._M_current =
         (pair<int,_int> *)
         std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end(candidates);
    bVar1 = __gnu_cxx::operator!=(&local_278,&local_280);
    if (!bVar1) break;
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_278);
    pvVar3 = std::
             vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ::operator[](trees_collection,(long)ppVar2->first);
    node::
    index_tree<node::TreeIndexLGM,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              ((TreeIndexLGM *)
               &ti_2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                _M_single_bucket,pvVar3,&this->ld_,
               (UnitCostModelLD<label::StringLabel> *)
               &lgm_algorithm.t2_label_il_._M_h._M_single_bucket);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             ::operator->(&local_278);
    pvVar3 = std::
             vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
             ::operator[](trees_collection,(long)ppVar2->second);
    node::
    index_tree<node::TreeIndexLGM,label::StringLabel,cost_model::UnitCostModelLD<label::StringLabel>>
              ((TreeIndexLGM *)&it,pvVar3,&this->ld_,
               (UnitCostModelLD<label::StringLabel> *)
               &lgm_algorithm.t2_label_il_._M_h._M_single_bucket);
    local_298 = ted_ub::
                LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
                ted_k((LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>
                       *)&ti_1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_.
                          _M_h._M_single_bucket,
                      (TreeIndexLGM *)
                      &ti_2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                       _M_single_bucket,(TreeIndexLGM *)&it,(int)distance_threshold);
    if (distance_threshold < local_298) {
      __gnu_cxx::
      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
      ::operator++(&local_278);
    }
    else {
      ppVar2 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_278);
      ppVar4 = __gnu_cxx::
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               ::operator->(&local_278);
      std::vector<join::JoinResultElement,std::allocator<join::JoinResultElement>>::
      emplace_back<int&,int&,double&>
                ((vector<join::JoinResultElement,std::allocator<join::JoinResultElement>> *)
                 join_result,&ppVar2->first,&ppVar4->second,&local_298);
      __p = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::back
                      (candidates);
      this_00 = __gnu_cxx::
                __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                ::operator*(&local_278);
      std::pair<int,_int>::operator=(this_00,__p);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::pop_back(candidates);
    }
  }
  node::TreeIndexLGM::~TreeIndexLGM((TreeIndexLGM *)&it);
  node::TreeIndexLGM::~TreeIndexLGM
            ((TreeIndexLGM *)
             &ti_2.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
              _M_single_bucket);
  ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
  ~LGMTreeIndex((LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *
                )&ti_1.super_InvertedListLabelIdToPostL.inverted_list_label_id_to_postl_._M_h.
                  _M_single_bucket);
  return;
}

Assistant:

void TJoinTI<Label, VerificationAlgorithm>::upperbound(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {
  
  typename VerificationAlgorithm::AlgsCostModel cm(ld_);
  ted_ub::LGMTreeIndex<typename VerificationAlgorithm::AlgsCostModel> lgm_algorithm(cm);
  // TODO: Index trees only once for LGM And Verification using a TreeIndex
  //       that is a superset of TreeIndexLGM and VerificationAlgorithm::AlgsTreeIndex.
  node::TreeIndexLGM ti_1;
  node::TreeIndexLGM ti_2;
  
  std::vector<std::pair<int, int>>::iterator it = candidates.begin();
  while(it != candidates.end()) {
    node::index_tree(ti_1, trees_collection[it->first], ld_, cm);
    node::index_tree(ti_2, trees_collection[it->second], ld_, cm);
    double ub_value = lgm_algorithm.ted_k(ti_1, ti_2, distance_threshold);
    if(ub_value <= distance_threshold) {
      join_result.emplace_back(it->first, it->second, ub_value);
      *it = candidates.back();
      candidates.pop_back();
    }
    else {
      ++it;
    }
  }
}